

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es31fTextureSpecificationTests.cpp
# Opt level: O0

void __thiscall
deqp::gles31::Functional::TexSubImageCubeArrayDepthCase::TexSubImageCubeArrayDepthCase
          (TexSubImageCubeArrayDepthCase *this,Context *context,char *name,char *desc,
          deUint32 internalFormat,int imageSize,int numLayers)

{
  int size;
  int numLevels;
  Vector<float,_4> local_64;
  Vector<float,_4> local_48;
  TextureFormat local_38;
  int local_30;
  deUint32 local_2c;
  int imageSize_local;
  deUint32 internalFormat_local;
  char *desc_local;
  char *name_local;
  Context *context_local;
  TexSubImageCubeArrayDepthCase *this_local;
  
  local_30 = imageSize;
  local_2c = internalFormat;
  _imageSize_local = desc;
  desc_local = name;
  name_local = (char *)context;
  context_local = (Context *)this;
  local_38 = glu::mapGLInternalFormat(internalFormat);
  size = local_30;
  numLevels = maxLevelCount(local_30);
  TextureCubeArraySpecCase::TextureCubeArraySpecCase
            (&this->super_TextureCubeArraySpecCase,context,name,desc,&local_38,size,numLayers,
             numLevels);
  (this->super_TextureCubeArraySpecCase).super_TextureSpecCase.super_TestCase.super_TestCase.
  super_TestNode._vptr_TestNode = (_func_int **)&PTR__TexSubImageCubeArrayDepthCase_032b5dd0;
  *(deUint32 *)&(this->super_TextureCubeArraySpecCase).field_0xd4 = local_2c;
  tcu::Vector<float,_4>::Vector(&local_48,0.25,0.0,0.0,1.0);
  *(undefined8 *)(this->super_TextureCubeArraySpecCase).m_texFormatInfo.lookupBias.m_data =
       local_48.m_data._0_8_;
  *(undefined8 *)((this->super_TextureCubeArraySpecCase).m_texFormatInfo.lookupBias.m_data + 2) =
       local_48.m_data._8_8_;
  tcu::Vector<float,_4>::Vector(&local_64,0.5,1.0,1.0,0.0);
  *(undefined8 *)(this->super_TextureCubeArraySpecCase).m_texFormatInfo.lookupScale.m_data =
       local_64.m_data._0_8_;
  *(undefined8 *)((this->super_TextureCubeArraySpecCase).m_texFormatInfo.lookupScale.m_data + 2) =
       local_64.m_data._8_8_;
  return;
}

Assistant:

TexSubImageCubeArrayDepthCase (Context&		context,
								 const char*	name,
								 const char*	desc,
								 deUint32		internalFormat,
								 int			imageSize,
								 int			numLayers)
		: TextureCubeArraySpecCase(context, name, desc, glu::mapGLInternalFormat(internalFormat), imageSize, numLayers, maxLevelCount(imageSize))
		, m_internalFormat		(internalFormat)
	{
		// we are interested in the behavior near [-2, 2], map it to visible range [0, 1]
		m_texFormatInfo.lookupBias = Vec4(0.25f, 0.0f, 0.0f, 1.0f);
		m_texFormatInfo.lookupScale = Vec4(0.5f, 1.0f, 1.0f, 0.0f);
	}